

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>
pbrt::Integrator::Create
          (string *name,ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,
          RGBColorSpace *colorSpace,FileLoc *loc)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  undefined1 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __uniq_ptr_data<pbrt::Integrator,_std::default_delete<pbrt::Integrator>,_true,_true> in_RDI;
  FileLoc *in_R8;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_00000010;
  unique_ptr<pbrt::AOIntegrator,_std::default_delete<pbrt::AOIntegrator>_> *in_stack_00000018;
  unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> *integrator;
  DenselySampledSpectrum *in_stack_fffffffffffffca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  unique_ptr<pbrt::AOIntegrator,_std::default_delete<pbrt::AOIntegrator>_>
  *in_stack_fffffffffffffcb8;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_fffffffffffffcc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  undefined7 in_stack_fffffffffffffce8;
  undefined1 in_stack_fffffffffffffcef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  PrimitiveHandle *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  CameraHandle *in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd88;
  SamplerHandle *in_stack_fffffffffffffd90;
  CameraHandle *in_stack_fffffffffffffd98;
  SpectrumHandle *in_stack_fffffffffffffda0;
  ParameterDictionary *in_stack_fffffffffffffda8;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_fffffffffffffdb8;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_fffffffffffffdc0;
  FileLoc *in_stack_fffffffffffffdc8;
  CameraHandle *in_stack_fffffffffffffdd0;
  ParameterDictionary *in_stack_fffffffffffffdd8;
  FileLoc *in_stack_fffffffffffffdf0;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_fffffffffffffe48;
  PrimitiveHandle *in_stack_fffffffffffffe50;
  SamplerHandle *in_stack_fffffffffffffe58;
  CameraHandle *in_stack_fffffffffffffe60;
  ParameterDictionary *in_stack_fffffffffffffe68;
  ParameterDictionary *in_stack_fffffffffffffe80;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_fffffffffffffe98;
  PrimitiveHandle *in_stack_fffffffffffffea0;
  SamplerHandle *in_stack_fffffffffffffea8;
  RGBColorSpace *in_stack_fffffffffffffeb0;
  ParameterDictionary *in_stack_fffffffffffffeb8;
  FileLoc *in_stack_fffffffffffffed0;
  FileLoc *in_stack_fffffffffffffee0;
  FileLoc *in_stack_fffffffffffffee8;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_fffffffffffffef0;
  PrimitiveHandle *in_stack_fffffffffffffef8;
  CameraHandle *in_stack_ffffffffffffff00;
  ParameterDictionary *in_stack_ffffffffffffff08;
  
  std::unique_ptr<pbrt::Integrator,std::default_delete<pbrt::Integrator>>::
  unique_ptr<std::default_delete<pbrt::Integrator>,void>
            ((unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> *)
             in_stack_fffffffffffffcb0);
  uVar1 = std::operator==(in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8);
  if ((bool)uVar1) {
    CameraHandle::CameraHandle
              ((CameraHandle *)in_stack_fffffffffffffcb0,(CameraHandle *)in_stack_fffffffffffffca8);
    SamplerHandle::SamplerHandle
              ((SamplerHandle *)in_stack_fffffffffffffcb0,(SamplerHandle *)in_stack_fffffffffffffca8
              );
    PrimitiveHandle::PrimitiveHandle
              ((PrimitiveHandle *)in_stack_fffffffffffffcb0,
               (PrimitiveHandle *)in_stack_fffffffffffffca8);
    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
              (in_stack_fffffffffffffd00,
               (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
               CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    PathIntegrator::Create
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
               (FileLoc *)in_stack_fffffffffffffe80);
    std::unique_ptr<pbrt::Integrator,std::default_delete<pbrt::Integrator>>::operator=
              ((unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> *)
               in_stack_fffffffffffffcc0,
               (unique_ptr<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>_> *)
               in_stack_fffffffffffffcb8);
    std::unique_ptr<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>_>::~unique_ptr
              ((unique_ptr<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>_> *)
               in_stack_fffffffffffffcb0);
    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
              (in_stack_fffffffffffffcc0);
  }
  else {
    uVar2 = std::operator==(in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8);
    if ((bool)uVar2) {
      CameraHandle::CameraHandle
                ((CameraHandle *)in_stack_fffffffffffffcb0,(CameraHandle *)in_stack_fffffffffffffca8
                );
      SamplerHandle::SamplerHandle
                ((SamplerHandle *)in_stack_fffffffffffffcb0,
                 (SamplerHandle *)in_stack_fffffffffffffca8);
      PrimitiveHandle::PrimitiveHandle
                ((PrimitiveHandle *)in_stack_fffffffffffffcb0,
                 (PrimitiveHandle *)in_stack_fffffffffffffca8);
      std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                (in_stack_fffffffffffffd00,
                 (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                 CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
      SimplePathIntegrator::Create
                (in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                 (SamplerHandle *)in_stack_fffffffffffffdc8,
                 (PrimitiveHandle *)in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 in_stack_fffffffffffffdf0);
      std::unique_ptr<pbrt::Integrator,std::default_delete<pbrt::Integrator>>::operator=
                ((unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> *)
                 in_stack_fffffffffffffcc0,
                 (unique_ptr<pbrt::SimplePathIntegrator,_std::default_delete<pbrt::SimplePathIntegrator>_>
                  *)in_stack_fffffffffffffcb8);
      std::unique_ptr<pbrt::SimplePathIntegrator,_std::default_delete<pbrt::SimplePathIntegrator>_>
      ::~unique_ptr((unique_ptr<pbrt::SimplePathIntegrator,_std::default_delete<pbrt::SimplePathIntegrator>_>
                     *)in_stack_fffffffffffffcb0);
      std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
                (in_stack_fffffffffffffcc0);
    }
    else {
      uVar3 = std::operator==(in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8);
      if ((bool)uVar3) {
        CameraHandle::CameraHandle
                  ((CameraHandle *)in_stack_fffffffffffffcb0,
                   (CameraHandle *)in_stack_fffffffffffffca8);
        SamplerHandle::SamplerHandle
                  ((SamplerHandle *)in_stack_fffffffffffffcb0,
                   (SamplerHandle *)in_stack_fffffffffffffca8);
        PrimitiveHandle::PrimitiveHandle
                  ((PrimitiveHandle *)in_stack_fffffffffffffcb0,
                   (PrimitiveHandle *)in_stack_fffffffffffffca8);
        std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                  (in_stack_fffffffffffffd00,
                   (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                   CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
        LightPathIntegrator::Create
                  ((ParameterDictionary *)CONCAT17(uVar2,in_stack_fffffffffffffd48),
                   in_stack_fffffffffffffd40,
                   (SamplerHandle *)CONCAT17(uVar3,in_stack_fffffffffffffd38),
                   (PrimitiveHandle *)in_RDX,
                   (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                   CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),in_R8);
        std::unique_ptr<pbrt::Integrator,std::default_delete<pbrt::Integrator>>::operator=
                  ((unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> *)
                   in_stack_fffffffffffffcc0,
                   (unique_ptr<pbrt::LightPathIntegrator,_std::default_delete<pbrt::LightPathIntegrator>_>
                    *)in_stack_fffffffffffffcb8);
        std::unique_ptr<pbrt::LightPathIntegrator,_std::default_delete<pbrt::LightPathIntegrator>_>
        ::~unique_ptr((unique_ptr<pbrt::LightPathIntegrator,_std::default_delete<pbrt::LightPathIntegrator>_>
                       *)in_stack_fffffffffffffcb0);
        std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
                  (in_stack_fffffffffffffcc0);
      }
      else {
        uVar4 = std::operator==(in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8);
        if ((bool)uVar4) {
          CameraHandle::CameraHandle
                    ((CameraHandle *)in_stack_fffffffffffffcb0,
                     (CameraHandle *)in_stack_fffffffffffffca8);
          SamplerHandle::SamplerHandle
                    ((SamplerHandle *)in_stack_fffffffffffffcb0,
                     (SamplerHandle *)in_stack_fffffffffffffca8);
          PrimitiveHandle::PrimitiveHandle
                    ((PrimitiveHandle *)in_stack_fffffffffffffcb0,
                     (PrimitiveHandle *)in_stack_fffffffffffffca8);
          std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                    (in_stack_fffffffffffffd00,
                     (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                     CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
          SimpleVolPathIntegrator::Create
                    ((ParameterDictionary *)CONCAT17(uVar2,in_stack_fffffffffffffd48),
                     in_stack_fffffffffffffd40,
                     (SamplerHandle *)CONCAT17(uVar3,in_stack_fffffffffffffd38),
                     in_stack_fffffffffffffd30,
                     (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                     CONCAT17(uVar4,in_stack_fffffffffffffd28),in_R8);
          std::unique_ptr<pbrt::Integrator,std::default_delete<pbrt::Integrator>>::operator=
                    ((unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> *)
                     in_stack_fffffffffffffcc0,
                     (unique_ptr<pbrt::SimpleVolPathIntegrator,_std::default_delete<pbrt::SimpleVolPathIntegrator>_>
                      *)in_stack_fffffffffffffcb8);
          std::
          unique_ptr<pbrt::SimpleVolPathIntegrator,_std::default_delete<pbrt::SimpleVolPathIntegrator>_>
          ::~unique_ptr((unique_ptr<pbrt::SimpleVolPathIntegrator,_std::default_delete<pbrt::SimpleVolPathIntegrator>_>
                         *)in_stack_fffffffffffffcb0);
          std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
                    (in_stack_fffffffffffffcc0);
        }
        else {
          bVar5 = std::operator==(in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8);
          if (bVar5) {
            CameraHandle::CameraHandle
                      ((CameraHandle *)in_stack_fffffffffffffcb0,
                       (CameraHandle *)in_stack_fffffffffffffca8);
            SamplerHandle::SamplerHandle
                      ((SamplerHandle *)in_stack_fffffffffffffcb0,
                       (SamplerHandle *)in_stack_fffffffffffffca8);
            PrimitiveHandle::PrimitiveHandle
                      ((PrimitiveHandle *)in_stack_fffffffffffffcb0,
                       (PrimitiveHandle *)in_stack_fffffffffffffca8);
            std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                      (in_stack_fffffffffffffd00,
                       (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                       CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
            VolPathIntegrator::Create
                      (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58
                       ,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                       (FileLoc *)in_stack_fffffffffffffe80);
            std::unique_ptr<pbrt::Integrator,std::default_delete<pbrt::Integrator>>::operator=
                      ((unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> *)
                       in_stack_fffffffffffffcc0,
                       (unique_ptr<pbrt::VolPathIntegrator,_std::default_delete<pbrt::VolPathIntegrator>_>
                        *)in_stack_fffffffffffffcb8);
            std::unique_ptr<pbrt::VolPathIntegrator,_std::default_delete<pbrt::VolPathIntegrator>_>
            ::~unique_ptr((unique_ptr<pbrt::VolPathIntegrator,_std::default_delete<pbrt::VolPathIntegrator>_>
                           *)in_stack_fffffffffffffcb0);
            std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
                      (in_stack_fffffffffffffcc0);
          }
          else {
            bVar5 = std::operator==(in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8);
            if (bVar5) {
              CameraHandle::CameraHandle
                        ((CameraHandle *)in_stack_fffffffffffffcb0,
                         (CameraHandle *)in_stack_fffffffffffffca8);
              SamplerHandle::SamplerHandle
                        ((SamplerHandle *)in_stack_fffffffffffffcb0,
                         (SamplerHandle *)in_stack_fffffffffffffca8);
              PrimitiveHandle::PrimitiveHandle
                        ((PrimitiveHandle *)in_stack_fffffffffffffcb0,
                         (PrimitiveHandle *)in_stack_fffffffffffffca8);
              std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                        ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)in_RDX,
                         (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                         CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
              BDPTIntegrator::Create
                        (in_stack_fffffffffffffeb8,(CameraHandle *)in_stack_fffffffffffffeb0,
                         in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                         in_stack_fffffffffffffe98,in_stack_fffffffffffffed0);
              std::unique_ptr<pbrt::Integrator,std::default_delete<pbrt::Integrator>>::operator=
                        ((unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> *)
                         in_stack_fffffffffffffcc0,
                         (unique_ptr<pbrt::BDPTIntegrator,_std::default_delete<pbrt::BDPTIntegrator>_>
                          *)in_stack_fffffffffffffcb8);
              std::unique_ptr<pbrt::BDPTIntegrator,_std::default_delete<pbrt::BDPTIntegrator>_>::
              ~unique_ptr((unique_ptr<pbrt::BDPTIntegrator,_std::default_delete<pbrt::BDPTIntegrator>_>
                           *)in_stack_fffffffffffffcb0);
              std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
                        (in_stack_fffffffffffffcc0);
            }
            else {
              uVar6 = std::operator==(in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8);
              if ((bool)uVar6) {
                CameraHandle::CameraHandle
                          ((CameraHandle *)in_stack_fffffffffffffcb0,
                           (CameraHandle *)in_stack_fffffffffffffca8);
                PrimitiveHandle::PrimitiveHandle
                          ((PrimitiveHandle *)in_stack_fffffffffffffcb0,
                           (PrimitiveHandle *)in_stack_fffffffffffffca8);
                std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                          (in_stack_fffffffffffffd00,
                           (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                           CONCAT17(uVar6,in_stack_fffffffffffffcf8));
                MLTIntegrator::Create
                          (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                           in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                           in_stack_fffffffffffffee8);
                std::unique_ptr<pbrt::Integrator,std::default_delete<pbrt::Integrator>>::operator=
                          ((unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> *)
                           in_stack_fffffffffffffcc0,
                           (unique_ptr<pbrt::MLTIntegrator,_std::default_delete<pbrt::MLTIntegrator>_>
                            *)in_stack_fffffffffffffcb8);
                std::unique_ptr<pbrt::MLTIntegrator,_std::default_delete<pbrt::MLTIntegrator>_>::
                ~unique_ptr((unique_ptr<pbrt::MLTIntegrator,_std::default_delete<pbrt::MLTIntegrator>_>
                             *)in_stack_fffffffffffffcb0);
                std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
                          (in_stack_fffffffffffffcc0);
                in_stack_fffffffffffffcf0 = in_RDX;
              }
              else {
                in_stack_fffffffffffffcef =
                     std::operator==(in_stack_fffffffffffffcb0,(char *)in_stack_fffffffffffffca8);
                if ((bool)in_stack_fffffffffffffcef) {
                  SpectrumHandle::TaggedPointer<pbrt::DenselySampledSpectrum_const>
                            ((SpectrumHandle *)in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
                  CameraHandle::CameraHandle
                            ((CameraHandle *)in_stack_fffffffffffffcb0,
                             (CameraHandle *)in_stack_fffffffffffffca8);
                  SamplerHandle::SamplerHandle
                            ((SamplerHandle *)in_stack_fffffffffffffcb0,
                             (SamplerHandle *)in_stack_fffffffffffffca8);
                  PrimitiveHandle::PrimitiveHandle
                            ((PrimitiveHandle *)in_stack_fffffffffffffcb0,
                             (PrimitiveHandle *)in_stack_fffffffffffffca8);
                  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                            (in_stack_fffffffffffffd00,
                             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                             CONCAT17(uVar6,in_stack_fffffffffffffcf8));
                  AOIntegrator::Create
                            (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                             in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                             (PrimitiveHandle *)CONCAT17(uVar1,in_stack_fffffffffffffd88),
                             in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8);
                  std::unique_ptr<pbrt::Integrator,std::default_delete<pbrt::Integrator>>::operator=
                            ((unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> *
                             )in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
                  std::unique_ptr<pbrt::AOIntegrator,_std::default_delete<pbrt::AOIntegrator>_>::
                  ~unique_ptr(in_stack_00000018);
                  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
                            (in_stack_fffffffffffffcc0);
                  in_stack_fffffffffffffce0 = in_RDX;
                }
                else {
                  bVar5 = std::operator==(in_stack_fffffffffffffcb0,
                                          (char *)in_stack_fffffffffffffca8);
                  if (bVar5) {
                    CameraHandle::CameraHandle
                              ((CameraHandle *)in_stack_fffffffffffffcb0,
                               (CameraHandle *)in_stack_fffffffffffffca8);
                    SamplerHandle::SamplerHandle
                              ((SamplerHandle *)in_stack_fffffffffffffcb0,
                               (SamplerHandle *)in_stack_fffffffffffffca8);
                    PrimitiveHandle::PrimitiveHandle
                              ((PrimitiveHandle *)in_stack_fffffffffffffcb0,
                               (PrimitiveHandle *)in_stack_fffffffffffffca8);
                    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                              (in_stack_fffffffffffffd00,
                               (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               CONCAT17(uVar6,in_stack_fffffffffffffcf8));
                    RandomWalkIntegrator::Create
                              ((ParameterDictionary *)CONCAT17(uVar2,in_stack_fffffffffffffd48),
                               in_stack_fffffffffffffd40,
                               (SamplerHandle *)CONCAT17(uVar3,in_stack_fffffffffffffd38),
                               in_stack_fffffffffffffd30,
                               (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               CONCAT17(uVar4,in_stack_fffffffffffffd28),in_R8);
                    std::unique_ptr<pbrt::Integrator,std::default_delete<pbrt::Integrator>>::
                    operator=((unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>
                               *)in_stack_fffffffffffffcc0,
                              (unique_ptr<pbrt::RandomWalkIntegrator,_std::default_delete<pbrt::RandomWalkIntegrator>_>
                               *)in_stack_fffffffffffffcb8);
                    std::
                    unique_ptr<pbrt::RandomWalkIntegrator,_std::default_delete<pbrt::RandomWalkIntegrator>_>
                    ::~unique_ptr((unique_ptr<pbrt::RandomWalkIntegrator,_std::default_delete<pbrt::RandomWalkIntegrator>_>
                                   *)in_stack_fffffffffffffcb0);
                    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
                              (in_stack_fffffffffffffcc0);
                  }
                  else {
                    bVar5 = std::operator==(in_stack_fffffffffffffcb0,
                                            (char *)in_stack_fffffffffffffca8);
                    if (!bVar5) {
                      ErrorExit<std::__cxx11::string_const&>
                                ((FileLoc *)in_stack_fffffffffffffcf0,
                                 (char *)CONCAT17(in_stack_fffffffffffffcef,
                                                  in_stack_fffffffffffffce8),
                                 in_stack_fffffffffffffce0);
                    }
                    CameraHandle::CameraHandle
                              ((CameraHandle *)in_stack_fffffffffffffcb0,
                               (CameraHandle *)in_stack_fffffffffffffca8);
                    PrimitiveHandle::PrimitiveHandle
                              ((PrimitiveHandle *)in_stack_fffffffffffffcb0,
                               (PrimitiveHandle *)in_stack_fffffffffffffca8);
                    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
                              (in_stack_fffffffffffffd00,
                               (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)
                               CONCAT17(uVar6,in_stack_fffffffffffffcf8));
                    SPPMIntegrator::Create
                              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                               (CameraHandle *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                               in_stack_fffffffffffffe98,in_stack_fffffffffffffee0);
                    std::unique_ptr<pbrt::Integrator,std::default_delete<pbrt::Integrator>>::
                    operator=((unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>
                               *)in_stack_00000010,
                              (unique_ptr<pbrt::SPPMIntegrator,_std::default_delete<pbrt::SPPMIntegrator>_>
                               *)in_RDX);
                    std::
                    unique_ptr<pbrt::SPPMIntegrator,_std::default_delete<pbrt::SPPMIntegrator>_>::
                    ~unique_ptr((unique_ptr<pbrt::SPPMIntegrator,_std::default_delete<pbrt::SPPMIntegrator>_>
                                 *)in_stack_fffffffffffffcb0);
                    std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::~vector
                              (in_stack_00000010);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar5 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_> *)
                     0x7f8429);
  if (!bVar5) {
    ErrorExit<std::__cxx11::string_const&>
              ((FileLoc *)in_stack_fffffffffffffcf0,
               (char *)CONCAT17(in_stack_fffffffffffffcef,in_stack_fffffffffffffce8),
               in_stack_fffffffffffffce0);
  }
  ParameterDictionary::ReportUnused(in_stack_fffffffffffffe80);
  return (__uniq_ptr_data<pbrt::Integrator,_std::default_delete<pbrt::Integrator>,_true,_true>)
         (tuple<pbrt::Integrator_*,_std::default_delete<pbrt::Integrator>_>)
         in_RDI.super___uniq_ptr_impl<pbrt::Integrator,_std::default_delete<pbrt::Integrator>_>._M_t
         .super__Tuple_impl<0UL,_pbrt::Integrator_*,_std::default_delete<pbrt::Integrator>_>.
         super__Head_base<0UL,_pbrt::Integrator_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Integrator> Integrator::Create(
    const std::string &name, const ParameterDictionary &parameters, CameraHandle camera,
    SamplerHandle sampler, PrimitiveHandle aggregate, std::vector<LightHandle> lights,
    const RGBColorSpace *colorSpace, const FileLoc *loc) {
    std::unique_ptr<Integrator> integrator;
    if (name == "path")
        integrator =
            PathIntegrator::Create(parameters, camera, sampler, aggregate, lights, loc);
    else if (name == "simplepath")
        integrator = SimplePathIntegrator::Create(parameters, camera, sampler, aggregate,
                                                  lights, loc);
    else if (name == "lightpath")
        integrator = LightPathIntegrator::Create(parameters, camera, sampler, aggregate,
                                                 lights, loc);
    else if (name == "simplevolpath")
        integrator = SimpleVolPathIntegrator::Create(parameters, camera, sampler,
                                                     aggregate, lights, loc);
    else if (name == "volpath")
        integrator = VolPathIntegrator::Create(parameters, camera, sampler, aggregate,
                                               lights, loc);
    else if (name == "bdpt")
        integrator =
            BDPTIntegrator::Create(parameters, camera, sampler, aggregate, lights, loc);
    else if (name == "mlt")
        integrator = MLTIntegrator::Create(parameters, camera, aggregate, lights, loc);
    else if (name == "ambientocclusion")
        integrator = AOIntegrator::Create(parameters, &colorSpace->illuminant, camera,
                                          sampler, aggregate, lights, loc);
    else if (name == "randomwalk")
        integrator = RandomWalkIntegrator::Create(parameters, camera, sampler, aggregate,
                                                  lights, loc);
    else if (name == "sppm")
        integrator = SPPMIntegrator::Create(parameters, colorSpace, camera, aggregate,
                                            lights, loc);
    else
        ErrorExit(loc, "%s: integrator type unknown.", name);

    if (!integrator)
        ErrorExit(loc, "%s: unable to create integrator.", name);

    parameters.ReportUnused();
    return integrator;
}